

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

int __thiscall HydEngine::solve(HydEngine *this,int *t)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  SystemError *this_00;
  int local_54;
  int local_50;
  int statusCode;
  int trials;
  Utilities local_40 [32];
  int *local_20;
  int *t_local;
  HydEngine *this_local;
  
  if (this->engineState == INITIALIZED) {
    local_20 = t;
    t_local = (int *)this;
    iVar2 = Network::option(this->network,REPORT_STATUS);
    if (iVar2 != 0) {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (&this->network->msgLog,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"  Hour ");
      Utilities::getTime_abi_cxx11_(local_40,this->currentTime);
      poVar3 = std::operator<<(poVar3,(string *)local_40);
      std::operator<<(poVar3,(string *)&this->timeStepReason);
      std::__cxx11::string::~string((string *)local_40);
    }
    *local_20 = this->currentTime;
    this->timeOfDay = (this->currentTime + this->startTime) % 0x15180;
    updateCurrentConditions(this);
    local_50 = 0;
    local_54 = (*this->hydSolver->_vptr_HydSolver[2])
                         ((double)this->hydStep,this->hydSolver,&local_50);
    if ((local_54 == 0) && (bVar1 = isPressureDeficient(this), bVar1)) {
      local_54 = resolvePressureDeficiency(this,&local_50);
    }
    reportDiagnostics(this,local_54,local_50);
    if ((this->halted & 1U) != 0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,9);
      __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
    }
    this_local._4_4_ = local_54;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int  HydEngine::solve(int* t)
{
    if ( engineState != HydEngine::INITIALIZED ) return 0;
    if ( network->option(Options::REPORT_STATUS) )
    {
        network->msgLog << endl << "  Hour " <<
            Utilities::getTime(currentTime) << timeStepReason;
    }

    *t = currentTime;
    timeOfDay = (currentTime + startTime) % 86400;
    updateCurrentConditions();

    //if ( network->option(Options::REPORT_TRIALS) )  network->msgLog << endl;
    int trials = 0;
    int statusCode = hydSolver->solve(hydStep, trials);

    if ( statusCode == HydSolver::SUCCESSFUL && isPressureDeficient() )
    {
        statusCode = resolvePressureDeficiency(trials);
    }
    reportDiagnostics(statusCode, trials);
    if ( halted ) throw SystemError(SystemError::HYDRAULICS_SOLVER_FAILURE);
    return statusCode;
}